

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O2

Cofaces_simplex_range * __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>::
cofaces_simplex_range
          (Cofaces_simplex_range *__return_storage_ptr__,
          Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured> *this,
          Simplex_handle *simplex,int codimension)

{
  bool bVar1;
  int iVar2;
  Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>
  last;
  Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>
  first;
  Fast_cofaces_predicate p;
  Static_vertex_vector simp;
  Simplex_vertex_range rg;
  Optimized_star_simplex_range range;
  Simplex_handle local_c28;
  long local_c20;
  static_vector<short,40ul,void> *local_c18;
  Simplex_handle local_c10;
  Static_vertex_vector local_c08;
  undefined1 local_bb0 [12];
  undefined1 local_ba0 [12];
  Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>
  local_b90;
  Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>
  local_8b8;
  iterator_range_base<Gudhi::Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_boost::iterators::incrementable_traversal_tag>
  local_5e0;
  
  if (codimension < 0) {
    __assert_fail("codimension >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/include/gudhi/Simplex_tree.h"
                  ,0x59f,
                  "Cofaces_simplex_range Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>::cofaces_simplex_range(const Simplex_handle, int) const [SimplexTreeOptions = Gudhi::Simplex_tree_options_custom_fil_values_full_featured]"
                 );
  }
  local_c10 = (Simplex_handle)(simplex->m_iit).members_.nodeptr_;
  simplex_vertex_range((Simplex_vertex_range *)local_bb0,this,&local_c10);
  last._12_4_ = 0;
  last.sib_ = (Siblings *)local_ba0._0_8_;
  last.v_ = local_ba0._8_2_;
  last._10_2_ = local_ba0._10_2_;
  first._12_4_ = 0;
  first.sib_ = (Siblings *)local_bb0._0_8_;
  first.v_ = local_bb0._8_2_;
  first._10_2_ = local_bb0._10_2_;
  boost::container::static_vector<short,40ul,void>::
  static_vector<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>>>
            ((static_vector<short,40ul,void> *)&local_c08,first,last);
  local_c20 = (long)&local_c08.
                     super_vector<short,_boost::container::dtl::static_storage_allocator<short,_40UL,_0UL,_true>,_void>
                     .m_holder.super_static_storage_allocator<short,_40UL,_0UL,_true>.storage +
              local_c08.
              super_vector<short,_boost::container::dtl::static_storage_allocator<short,_40UL,_0UL,_true>,_void>
              .m_holder.m_size * 2;
  local_c18 = (static_vector<short,40ul,void> *)&local_c08;
  bVar1 = std::is_sorted<boost::container::vec_iterator<short*,false>,std::greater<short>>();
  if (bVar1) {
    Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>
    ::Simplex_tree_optimized_star_simplex_iterator(&local_8b8,this,&local_c08);
    Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>
    ::Simplex_tree_optimized_star_simplex_iterator(&local_b90);
    boost::
    iterator_range<Gudhi::Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>>>
    ::
    iterator_range<Gudhi::Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>>>
              ((iterator_range<Gudhi::Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>>>
                *)&local_5e0,&local_8b8,&local_b90);
    std::
    _Vector_base<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>,_boost::container::map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_std::less<short>,_void,_void>_>_*,_std::allocator<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>,_boost::container::map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_std::less<short>,_void,_void>_>_*>_>
    ::~_Vector_base(&local_b90.children_stack_.
                     super__Vector_base<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>,_boost::container::map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_std::less<short>,_void,_void>_>_*,_std::allocator<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>,_boost::container::map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_std::less<short>,_void,_void>_>_*>_>
                   );
    std::
    _Vector_base<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>,_boost::container::map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_std::less<short>,_void,_void>_>_*,_std::allocator<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>,_boost::container::map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_std::less<short>,_void,_void>_>_*>_>
    ::~_Vector_base(&local_8b8.children_stack_.
                     super__Vector_base<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>,_boost::container::map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_std::less<short>,_void,_void>_>_*,_std::allocator<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>,_boost::container::map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_std::less<short>,_void,_void>_>_*>_>
                   );
    local_c28 = (Simplex_handle)(simplex->m_iit).members_.nodeptr_;
    iVar2 = dimension(this,&local_c28);
    p.dim_ = iVar2 + codimension;
    p.codim_ = codimension;
    p.st_ = this;
    boost::range_detail::
    filtered_range<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>::Fast_cofaces_predicate,_boost::iterator_range<Gudhi::Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>_>
    ::filtered_range(__return_storage_ptr__,p,
                     (iterator_range<Gudhi::Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>
                      *)&local_5e0);
    boost::iterator_range_detail::
    iterator_range_base<Gudhi::Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_boost::iterators::incrementable_traversal_tag>
    ::~iterator_range_base(&local_5e0);
    return __return_storage_ptr__;
  }
  __assert_fail("std::is_sorted(simp.begin(), simp.end(), std::greater<Vertex_handle>())",
                "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/include/gudhi/Simplex_tree.h"
                ,0x5a5,
                "Cofaces_simplex_range Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>::cofaces_simplex_range(const Simplex_handle, int) const [SimplexTreeOptions = Gudhi::Simplex_tree_options_custom_fil_values_full_featured]"
               );
}

Assistant:

Cofaces_simplex_range cofaces_simplex_range(const Simplex_handle simplex, int codimension) const{
    // codimension must be positive or null integer
    assert(codimension >= 0);

    if constexpr (Options::link_nodes_by_label) {
      Simplex_vertex_range rg = simplex_vertex_range(simplex);
      Static_vertex_vector simp(rg.begin(), rg.end());
      // must be sorted in decreasing order
      assert(std::is_sorted(simp.begin(), simp.end(), std::greater<Vertex_handle>()));
      auto range = Optimized_star_simplex_range(Optimized_star_simplex_iterator(this, std::move(simp)),
                                                Optimized_star_simplex_iterator());
      // Lazy filtered range
      Fast_cofaces_predicate select(this, codimension, this->dimension(simplex));
      return boost::adaptors::filter(range, select);
    } else {
      Cofaces_simplex_range cofaces;
      Simplex_vertex_range rg = simplex_vertex_range(simplex);
      std::vector<Vertex_handle> copy(rg.begin(), rg.end());
      if (codimension + static_cast<int>(copy.size()) > dimension_ + 1 ||
          (codimension == 0 && static_cast<int>(copy.size()) > dimension_))  // n+codimension greater than dimension_
        return cofaces;
      // must be sorted in decreasing order
      assert(std::is_sorted(copy.begin(), copy.end(), std::greater<Vertex_handle>()));
      bool star = codimension == 0;
      rec_coface(copy, &root_, 1, cofaces, star, codimension + static_cast<int>(copy.size()));
      return cofaces;
    }
  }